

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureCubeMapArrayStencilAttachments::iterate(TextureCubeMapArrayStencilAttachments *this)

{
  CubeMapArrayDataStorage *pCVar1;
  ulong __n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  GLubyte *__s;
  char *description;
  GLuint n_layer;
  uint uVar7;
  GLuint test_index;
  GLuint test_index_00;
  long lVar8;
  long lVar6;
  
  initTest(this);
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  lVar8 = 0;
  (**(code **)(lVar6 + 0x12c8))(0x201,0,0xff);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Could not setup stencil function",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0xba);
  (**(code **)(lVar6 + 0x12e8))(0x1e00,0x1e00,0x1e00);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Could not setup stencil operation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0xbe);
  (**(code **)(lVar6 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Could not set stencil color value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0xc2);
  bVar3 = false;
  do {
    if (lVar8 == 4) break;
    test_index_00 = (GLuint)lVar8;
    buildAndUseProgram(this,test_index_00);
    initTestIteration(this,test_index_00);
    (**(code **)(lVar6 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"Could not clear color buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                    ,0xd1);
    (**(code **)(lVar6 + 0x538))(5,0,4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"Rendering failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                    ,0xd5);
    pCVar1 = this->m_cube_map_array_data;
    __n = (ulong)(pCVar1[lVar8].m_width * pCVar1[lVar8].m_height * pCVar1[lVar8].m_depth * 4) /
          (ulong)pCVar1[lVar8].m_depth;
    __s = (GLubyte *)operator_new__(__n);
    this->m_result_data = __s;
    memset(__s,0,__n);
    (**(code **)(lVar6 + 0x78))(0x8ca8,this->m_fbo_read_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"Could not bind read framebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                    ,0xe0);
    if (this->m_fbo_layered == '\0') {
      (**(code **)(lVar6 + 0x6b8))(0x8ca8,0x8ce0,this->m_texture_cube_array_color_id,0,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"Could not attach texture layer to color attachment of read framebuffer"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                      ,0xfa);
      bVar3 = readPixelsAndCompareWithExpectedResult(this,test_index_00);
    }
    else {
      uVar7 = 0;
      do {
        if (this->m_cube_map_array_data[lVar8].m_depth <= uVar7) goto LAB_00d45eef;
        bVar3 = false;
        (**(code **)(lVar6 + 0x6b8))(0x8ca8,0x8ce0,this->m_texture_cube_array_color_id,0);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,
                        "Could not attach texture layer to color attachment of read framebuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                        ,0xea);
        bVar2 = readPixelsAndCompareWithExpectedResult(this,test_index_00);
        uVar7 = uVar7 + 1;
      } while (!bVar2);
      bVar3 = true;
    }
LAB_00d45eef:
    cleanAfterTest(this);
    lVar8 = lVar8 + 1;
  } while (bVar3 == false);
  if (bVar3 == false) {
    description = "Pass";
  }
  else {
    description = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(bVar3 != false),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureCubeMapArrayStencilAttachments::iterate(void)
{
	initTest();

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up stencil function */
	gl.stencilFunc(GL_LESS, 0 /* ref */, 0xFF /* mask */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not setup stencil function");

	/* Set up stencil operation */
	gl.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not setup stencil operation");

	/* Set up clear color */
	gl.clearColor(1 /* red */, 0 /* green */, 0 /* blue */, 1 /* alpha */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set stencil color value!");

	bool has_test_failed = false;

	/* Iterate through all defined configurations */
	for (glw::GLuint test_index = 0; test_index < m_n_cube_map_array_configurations; test_index++)
	{
		/* Build and activate a test-specific program object */
		buildAndUseProgram(test_index);

		/* Create textures, framebuffer... before for every test iteration */
		initTestIteration(test_index);

		/* Clear the color buffer with (1, 0, 0, 1) color */
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear color buffer");

		/* Draw a full-screen quad */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

		/* Read the rendered data */
		glw::GLuint array_size =
			m_cube_map_array_data[test_index].getArraySize() / m_cube_map_array_data[test_index].getDepth();

		m_result_data = new glw::GLubyte[array_size];

		memset(m_result_data, 0, sizeof(glw::GLubyte) * array_size);

		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind read framebuffer");

		if (m_fbo_layered)
		{
			for (glw::GLuint n_layer = 0; n_layer < m_cube_map_array_data[test_index].getDepth(); ++n_layer)
			{
				gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture_cube_array_color_id,
										   0, /* level */
										   n_layer);
				GLU_EXPECT_NO_ERROR(gl.getError(),
									"Could not attach texture layer to color attachment of read framebuffer");

				/* Is the data correct? */
				has_test_failed = readPixelsAndCompareWithExpectedResult(test_index);

				if (has_test_failed)
				{
					break;
				}
			} /* for (all layers) */
		}	 /* if (m_fbo_layered) */
		else
		{
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture_cube_array_color_id,
									   0 /* level */, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"Could not attach texture layer to color attachment of read framebuffer");

			/* Is the data correct? */
			has_test_failed = readPixelsAndCompareWithExpectedResult(test_index);
		}

		/* Clean up */
		cleanAfterTest();

		if (has_test_failed)
		{
			break;
		}
	} /* for (all configurations) */

	if (has_test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}